

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O3

bool __thiscall MountPoint::parse(MountPoint *this,string *line)

{
  undefined8 *puVar1;
  pointer pSVar2;
  pointer pSVar3;
  StringPiece input;
  size_t sVar4;
  undefined8 uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  long lVar10;
  StringPiece input_00;
  vector<StringPiece,_std::allocator<StringPiece>_> pieces;
  undefined1 local_68 [39];
  allocator_type local_41;
  vector<StringPiece,_std::allocator<StringPiece>_> local_40;
  
  input.str_ = (line->_M_dataplus)._M_p;
  input.len_ = line->_M_string_length;
  SplitStringPiece(&local_40,input,' ');
  uVar8 = (long)local_40.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_40.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                super__Vector_impl_data._M_start >> 4;
  bVar9 = uVar8 >= 10;
  if (uVar8 < 10) {
LAB_0012706a:
    if (local_40.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      return bVar9;
    }
  }
  else {
    lVar7 = 10 - uVar8;
    lVar10 = 0x60;
    do {
      if ((*(long *)((long)&(local_40.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                             _M_impl.super__Vector_impl_data._M_start)->len_ + lVar10) == 1) &&
         (**(char **)((long)&(local_40.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>
                              ._M_impl.super__Vector_impl_data._M_start)->str_ + lVar10) == '-')) {
        if (lVar7 == 0) {
          pSVar2 = (pointer)(local_68 + 0x10);
          local_68._0_8_ = pSVar2;
          if ((local_40.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
               super__Vector_impl_data._M_start)->len_ == 0) {
            local_68._8_8_ = (pointer)0x0;
            local_68._16_8_ = local_68._16_8_ & 0xffffffffffffff00;
            iVar6 = atoi((char *)pSVar2);
            this->mountId = iVar6;
          }
          else {
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_68,
                       (local_40.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                        _M_impl.super__Vector_impl_data._M_start)->str_,
                       (local_40.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                        _M_impl.super__Vector_impl_data._M_start)->str_ +
                       (local_40.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                        _M_impl.super__Vector_impl_data._M_start)->len_);
            uVar5 = local_68._0_8_;
            iVar6 = atoi((char *)local_68._0_8_);
            this->mountId = iVar6;
            if ((pointer)uVar5 != pSVar2) {
              operator_delete((void *)uVar5,(ulong)((long)(char **)local_68._16_8_ + 1));
            }
          }
          if (local_40.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
              super__Vector_impl_data._M_start[1].len_ == 0) {
            local_68._8_8_ = (pointer)0x0;
            local_68._16_8_ = local_68._16_8_ & 0xffffffffffffff00;
            local_68._0_8_ = pSVar2;
            iVar6 = atoi((char *)pSVar2);
            this->parentId = iVar6;
          }
          else {
            local_68._0_8_ = pSVar2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_68,
                       local_40.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                       _M_impl.super__Vector_impl_data._M_start[1].str_,
                       local_40.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                       _M_impl.super__Vector_impl_data._M_start[1].str_ +
                       local_40.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                       _M_impl.super__Vector_impl_data._M_start[1].len_);
            uVar5 = local_68._0_8_;
            iVar6 = atoi((char *)local_68._0_8_);
            this->parentId = iVar6;
            if ((pointer)uVar5 != pSVar2) {
              operator_delete((void *)uVar5,(ulong)((long)(char **)local_68._16_8_ + 1));
            }
          }
          sVar4 = local_40.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                  super__Vector_impl_data._M_start[2].len_;
          (this->deviceId).str_ =
               local_40.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
               super__Vector_impl_data._M_start[2].str_;
          (this->deviceId).len_ = sVar4;
          sVar4 = local_40.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                  super__Vector_impl_data._M_start[3].len_;
          (this->root).str_ =
               local_40.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
               super__Vector_impl_data._M_start[3].str_;
          (this->root).len_ = sVar4;
          sVar4 = local_40.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                  super__Vector_impl_data._M_start[4].len_;
          (this->mountPoint).str_ =
               local_40.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
               super__Vector_impl_data._M_start[4].str_;
          (this->mountPoint).len_ = sVar4;
          SplitStringPiece((vector<StringPiece,_std::allocator<StringPiece>_> *)local_68,
                           local_40.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                           _M_impl.super__Vector_impl_data._M_start[5],',');
          pSVar2 = (this->options).super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pSVar3 = (this->options).super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
          (this->options).super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_68._0_8_;
          (this->options).super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)local_68._8_8_;
          (this->options).super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)local_68._16_8_;
          local_68._0_8_ = (pointer)0x0;
          local_68._8_8_ = (pointer)0x0;
          local_68._16_8_ = (pointer)0x0;
          if ((pSVar2 != (pointer)0x0) &&
             (operator_delete(pSVar2,(long)pSVar3 - (long)pSVar2),
             (pointer)local_68._0_8_ != (pointer)0x0)) {
            operator_delete((void *)local_68._0_8_,local_68._16_8_ - local_68._0_8_);
          }
          std::vector<StringPiece,std::allocator<StringPiece>>::vector<StringPiece*,void>
                    ((vector<StringPiece,std::allocator<StringPiece>> *)local_68,
                     local_40.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_start + 6,
                     (StringPiece *)
                     ((long)&(local_40.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>
                              ._M_impl.super__Vector_impl_data._M_start)->str_ + lVar10),&local_41);
          pSVar2 = (this->optionalFields).
                   super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pSVar3 = (this->optionalFields).
                   super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          (this->optionalFields).super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)local_68._0_8_;
          (this->optionalFields).super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)local_68._8_8_;
          (this->optionalFields).super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_68._16_8_;
          local_68._0_8_ = (pointer)0x0;
          local_68._8_8_ = (pointer)0x0;
          local_68._16_8_ = (pointer)0x0;
          if ((pSVar2 != (pointer)0x0) &&
             (operator_delete(pSVar2,(long)pSVar3 - (long)pSVar2),
             (pointer)local_68._0_8_ != (pointer)0x0)) {
            operator_delete((void *)local_68._0_8_,local_68._16_8_ - local_68._0_8_);
          }
          puVar1 = (undefined8 *)
                   ((long)&local_40.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                           _M_impl.super__Vector_impl_data._M_start[1].str_ + lVar10);
          sVar4 = puVar1[1];
          (this->fsType).str_ = (char *)*puVar1;
          (this->fsType).len_ = sVar4;
          puVar1 = (undefined8 *)
                   ((long)&local_40.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                           _M_impl.super__Vector_impl_data._M_start[2].str_ + lVar10);
          sVar4 = puVar1[1];
          (this->mountSource).str_ = (char *)*puVar1;
          (this->mountSource).len_ = sVar4;
          input_00.len_ =
               *(size_t *)
                ((long)&local_40.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                        _M_impl.super__Vector_impl_data._M_start[3].len_ + lVar10);
          input_00.str_ =
               *(char **)((long)&local_40.
                                 super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                                 _M_impl.super__Vector_impl_data._M_start[3].str_ + lVar10);
          SplitStringPiece((vector<StringPiece,_std::allocator<StringPiece>_> *)local_68,input_00,
                           ',');
          pSVar2 = (this->superOptions).
                   super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pSVar3 = (this->superOptions).
                   super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          (this->superOptions).super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)local_68._0_8_;
          (this->superOptions).super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl
          .super__Vector_impl_data._M_finish = (pointer)local_68._8_8_;
          (this->superOptions).super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage = (pointer)local_68._16_8_;
          local_68._0_8_ = (pointer)0x0;
          local_68._8_8_ = (pointer)0x0;
          local_68._16_8_ = (pointer)0x0;
          if ((pSVar2 != (pointer)0x0) &&
             (operator_delete(pSVar2,(long)pSVar3 - (long)pSVar2),
             (pointer)local_68._0_8_ != (pointer)0x0)) {
            operator_delete((void *)local_68._0_8_,local_68._16_8_ - local_68._0_8_);
          }
          goto LAB_0012706a;
        }
        break;
      }
      lVar10 = lVar10 + 0x10;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    bVar9 = false;
  }
  operator_delete(local_40.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_40.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_40.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  return bVar9;
}

Assistant:

bool parse(const string& line) {
    vector<StringPiece> pieces = SplitStringPiece(line, ' ');
    if (pieces.size() < 10)
      return false;
    size_t optionalStart = 0;
    for (size_t i = 6; i < pieces.size(); i++) {
      if (pieces[i] == "-") {
        optionalStart = i + 1;
        break;
      }
    }
    if (optionalStart == 0)
      return false;
    if (optionalStart + 3 != pieces.size())
      return false;
    mountId = atoi(pieces[0].AsString().c_str());
    parentId = atoi(pieces[1].AsString().c_str());
    deviceId = pieces[2];
    root = pieces[3];
    mountPoint = pieces[4];
    options = SplitStringPiece(pieces[5], ',');
    optionalFields =
        vector<StringPiece>(&pieces[6], &pieces[optionalStart - 1]);
    fsType = pieces[optionalStart];
    mountSource = pieces[optionalStart + 1];
    superOptions = SplitStringPiece(pieces[optionalStart + 2], ',');
    return true;
  }